

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O3

void __thiscall
glslang::TBuiltIns::addTabledBuiltins
          (TBuiltIns *this,int version,EProfile profile,SpvVersion *spvVersion)

{
  anon_class_24_3_9116b085 forEachFunction;
  EProfile local_40;
  int local_3c;
  anon_class_24_3_9116b085 local_38;
  
  local_38.version = &local_3c;
  local_38.profile = &local_40;
  local_40 = profile;
  local_3c = version;
  local_38.spvVersion = spvVersion;
  addTabledBuiltins::anon_class_24_3_9116b085::operator()
            (&local_38,&(this->super_TBuiltInParseables).commonBuiltins,
             (span<const_glslang::(anonymous_namespace)::BuiltInFunction> *)
             &(anonymous_namespace)::BaseFunctions);
  addTabledBuiltins::anon_class_24_3_9116b085::operator()
            (&local_38,(this->super_TBuiltInParseables).stageBuiltins + 4,
             (span<const_glslang::(anonymous_namespace)::BuiltInFunction> *)
             &(anonymous_namespace)::DerivativeFunctions);
  if ((local_40 == EEsProfile && 0x13f < local_3c) || (0x1c1 < local_3c && local_40 != EEsProfile))
  {
    addTabledBuiltins::anon_class_24_3_9116b085::operator()
              (&local_38,(this->super_TBuiltInParseables).stageBuiltins + 5,
               (span<const_glslang::(anonymous_namespace)::BuiltInFunction> *)
               &(anonymous_namespace)::DerivativeFunctions);
  }
  return;
}

Assistant:

void TBuiltIns::addTabledBuiltins(int version, EProfile profile, const SpvVersion& spvVersion)
{
    const auto forEachFunction = [&](TString& decls, const span<const BuiltInFunction>& functions) {
        for (const auto& fn : functions) {
            if (ValidVersion(fn, version, profile, spvVersion))
                AddTabledBuiltin(decls, fn);
        }
    };

    forEachFunction(commonBuiltins, BaseFunctions);
    forEachFunction(stageBuiltins[EShLangFragment], DerivativeFunctions);

    if ((profile == EEsProfile && version >= 320) || (profile != EEsProfile && version >= 450))
        forEachFunction(stageBuiltins[EShLangCompute], DerivativeFunctions);
}